

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_IteratorClose(JSContext *ctx,JSValue enum_obj,BOOL is_exception_pending)

{
  long lVar1;
  JSValue func_obj;
  int iVar2;
  int in_ECX;
  long in_RDI;
  JSValue JVar3;
  JSAtom in_stack_0000005c;
  JSContext *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  int res;
  JSValue ex_obj;
  JSValue ret;
  JSValue method;
  BOOL in_stack_00000100;
  JSContext *in_stack_ffffffffffffff10;
  JSValue in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 auVar4 [12];
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  int64_t in_stack_ffffffffffffff60;
  uint uStack_94;
  int local_84;
  JSValue *argv;
  JSValueUnion local_10;
  int64_t local_8;
  
  auVar4 = in_stack_ffffffffffffff38._4_12_;
  if (in_ECX == 0) {
    in_stack_ffffffffffffff58 = 0;
    in_stack_ffffffffffffff60 = 3;
    argv = (JSValue *)((ulong)in_stack_ffffffffffffff5c << 0x20);
    local_84 = 0;
  }
  else {
    argv = *(JSValue **)(*(long *)(in_RDI + 0x18) + 0xe0);
    lVar1 = *(long *)(in_RDI + 0x18);
    *(ulong *)(lVar1 + 0xe0) = (ulong)uStack_94 << 0x20;
    *(undefined8 *)(lVar1 + 0xe8) = 2;
    local_84 = -1;
  }
  JVar3 = JS_GetPropertyInternal
                    (in_stack_00000060,ex_obj,in_stack_0000005c,(JSValue)in_stack_00000068,
                     in_stack_00000100);
  local_10 = JVar3.u;
  local_8 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    iVar2 = JS_IsUndefined(JVar3);
    if ((iVar2 == 0) && (iVar2 = JS_IsNull(JVar3), iVar2 == 0)) {
      func_obj.u._4_4_ = in_stack_ffffffffffffff5c;
      func_obj.u.int32 = in_stack_ffffffffffffff58;
      func_obj.tag = in_stack_ffffffffffffff60;
      JVar3.tag = local_8;
      JVar3.u.float64 = local_10.float64;
      JVar3 = JS_CallFree(auVar4._4_8_,func_obj,JVar3,auVar4._0_4_,argv);
      if (in_ECX == 0) {
        iVar2 = JS_IsException(JVar3);
        if (iVar2 == 0) {
          iVar2 = JS_IsObject(JVar3);
          if (iVar2 == 0) {
            JS_ThrowTypeErrorNotAnObject((JSContext *)0x15eecb);
            local_84 = -1;
          }
        }
        else {
          local_84 = -1;
        }
      }
      JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    }
  }
  else {
    local_84 = -1;
  }
  if (in_ECX != 0) {
    JS_Throw(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  }
  return local_84;
}

Assistant:

static int JS_IteratorClose(JSContext *ctx, JSValueConst enum_obj,
                            BOOL is_exception_pending)
{
    JSValue method, ret, ex_obj;
    int res;

    if (is_exception_pending) {
        ex_obj = ctx->rt->current_exception;
        ctx->rt->current_exception = JS_NULL;
        res = -1;
    } else {
        ex_obj = JS_UNDEFINED;
        res = 0;
    }
    method = JS_GetProperty(ctx, enum_obj, JS_ATOM_return);
    if (JS_IsException(method)) {
        res = -1;
        goto done;
    }
    if (JS_IsUndefined(method) || JS_IsNull(method)) {
        goto done;
    }
    ret = JS_CallFree(ctx, method, enum_obj, 0, NULL);
    if (!is_exception_pending) {
        if (JS_IsException(ret)) {
            res = -1;
        } else if (!JS_IsObject(ret)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            res = -1;
        }
    }
    JS_FreeValue(ctx, ret);
 done:
    if (is_exception_pending) {
        JS_Throw(ctx, ex_obj);
    }
    return res;
}